

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.h
# Opt level: O0

void sha256_block_pad(sha256_block *blk,BinarySink *bs)

{
  uint64_t uVar1;
  size_t sVar2;
  ulong local_30;
  size_t i;
  size_t pad;
  uint64_t final_len;
  BinarySink *bs_local;
  sha256_block *blk_local;
  
  uVar1 = blk->len;
  sVar2 = blk->used;
  BinarySink_put_byte(bs->binarysink_,0x80);
  for (local_30 = 1; local_30 < (0x37 - sVar2 & 0x3f) + 1; local_30 = local_30 + 1) {
    BinarySink_put_byte(bs->binarysink_,'\0');
  }
  BinarySink_put_uint64(bs->binarysink_,uVar1 << 3);
  if (blk->used != 0) {
    __assert_fail("blk->used == 0 && \"Should have exactly hit a block boundary\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/sha256.h"
                  ,0x68,"void sha256_block_pad(sha256_block *, BinarySink *)");
  }
  return;
}

Assistant:

static inline void sha256_block_pad(sha256_block *blk, BinarySink *bs)
{
    uint64_t final_len = blk->len << 3;
    size_t pad = 1 + (63 & (55 - blk->used));

    put_byte(bs, 0x80);
    for (size_t i = 1; i < pad; i++)
        put_byte(bs, 0);
    put_uint64(bs, final_len);

    assert(blk->used == 0 && "Should have exactly hit a block boundary");
}